

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void set_get_meta_test(void)

{
  fdb_status fVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char keybuf [256];
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *handle;
  char *meta;
  size_t in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  fdb_doc **in_stack_fffffffffffffd88;
  size_t bodylen;
  fdb_doc *in_stack_fffffffffffffdc0;
  fdb_kvs_handle *in_stack_fffffffffffffdc8;
  fdb_doc *in_stack_fffffffffffffdd0;
  fdb_kvs_handle *in_stack_fffffffffffffdd8;
  fdb_doc *local_170;
  fdb_kvs_handle *local_168;
  char local_158 [104];
  fdb_kvs_config *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  fdb_kvs_handle **in_stack_ffffffffffffff20;
  fdb_file_handle *in_stack_ffffffffffffff28;
  fdb_config *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  fdb_file_handle **in_stack_ffffffffffffff98;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  bodylen = 0x400;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  fdb_kvs_open(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10);
  sprintf(local_158,"key%d",0);
  meta = local_158;
  strlen(local_158);
  handle = (fdb_kvs_handle *)0x0;
  fdb_doc_create(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,meta,
                 0,(void *)0x10a646,bodylen);
  fdb_set(local_168,local_170);
  fVar1 = fdb_get(local_168,local_170);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x347);
    set_get_meta_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x347,"void set_get_meta_test()");
    }
  }
  fVar1 = fdb_get_metaonly(local_168,local_170);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x349,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_metaonly_byseq(local_168,local_170);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x34b);
    set_get_meta_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34b,"void set_get_meta_test()");
    }
  }
  fdb_del(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  fVar1 = fdb_get(local_168,local_170);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x34f,"void set_get_meta_test()");
  }
  if ((local_170->deleted & 1U) != 1) {
    __assert_fail("rdoc->deleted == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x350,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_metaonly(local_168,local_170);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x353,"void set_get_meta_test()");
  }
  if ((local_170->deleted & 1U) != 1) {
    __assert_fail("rdoc->deleted == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x354,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_metaonly_byseq(local_168,local_170);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x357);
    set_get_meta_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x357,"void set_get_meta_test()");
    }
  }
  if ((local_170->deleted & 1U) != 1) {
    __assert_fail("rdoc->deleted == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x358,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x35b);
    set_get_meta_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x35b,"void set_get_meta_test()");
    }
  }
  if ((local_170->deleted & 1U) != 1) {
    __assert_fail("rdoc->deleted == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x35c,"void set_get_meta_test()");
  }
  fdb_doc_free((fdb_doc *)0x10aa75);
  fdb_kvs_close(handle);
  fdb_close((fdb_file_handle *)handle);
  fdb_shutdown();
  memleak_end();
  if (set_get_meta_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","set get meta test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","set get meta test");
  }
  return;
}

Assistant:

void set_get_meta_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.purging_interval = 1;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);

    sprintf(keybuf, "key%d", 0);
    fdb_doc_create(&rdoc, keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    fdb_set(db, rdoc);
    status = fdb_get(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    status = fdb_get_byoffset(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get_metaonly(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    status = fdb_get_metaonly_byseq(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_del(db, rdoc);
    status = fdb_get(db, rdoc);
    assert(status == FDB_RESULT_KEY_NOT_FOUND);
    assert(rdoc->deleted == true);

    status = fdb_get_metaonly(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    assert(rdoc->deleted == true);

    status = fdb_get_metaonly_byseq(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    assert(rdoc->deleted == true);

    status = fdb_get_byoffset(db, rdoc);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    assert(rdoc->deleted == true);


    fdb_doc_free(rdoc);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get meta test");
}